

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O1

void __thiscall bandit::reporter::spec::it_skip(spec *this,string *desc)

{
  int *piVar1;
  ostream *poVar2;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_skipped_;
  *piVar1 = *piVar1 + 1;
  poVar2 = (this->super_colored_base).stm_;
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indentation_);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"- it ",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(desc->_M_dataplus)._M_p,desc->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ... SKIPPED",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void it_skip(const std::string& desc) override {
        progress_base::it_skip(desc);
        stm_ << indent() << "- it " << desc << " ... SKIPPED" << std::endl;
        stm_.flush();
      }